

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t *
Aig_ManPartitionSmart(Aig_Man_t *p,int nSuppSizeLimit,int fVerbose,Vec_Ptr_t **pvPartSupps)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vPartSuppsBit;
  void **ppvVar3;
  undefined8 *__ptr;
  void *pvVar4;
  Vec_Ptr_t *vPartSuppsAll;
  void **ppvVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint *puVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  Aig_Man_t *pAVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  timespec ts;
  int local_c8;
  Vec_Ptr_t local_b8;
  ulong local_a8;
  Vec_Ptr_t *local_a0;
  int local_94;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  Vec_Ptr_t *local_78;
  long local_70;
  Aig_Man_t *local_68;
  long local_60;
  Vec_Int_t *local_58;
  long local_50;
  Vec_Ptr_t *local_48;
  ulong local_40;
  Vec_Ptr_t **local_38;
  
  local_94 = nSuppSizeLimit;
  local_68 = p;
  local_38 = pvPartSupps;
  iVar1 = clock_gettime(3,(timespec *)&local_b8);
  if (iVar1 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_b8.pArray),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_b8._0_8_ * -1000000;
  }
  pAVar13 = local_68;
  local_78 = Aig_ManSupports(local_68);
  if (fVerbose != 0) {
    Abc_Print((int)pAVar13,"%s =","Supps");
    iVar17 = 3;
    iVar1 = clock_gettime(3,(timespec *)&local_b8);
    if (iVar1 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = (long)local_b8.pArray / 1000 + local_b8._0_8_ * 1000000;
    }
    Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  }
  vPartSuppsBit = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsBit->nCap = 1000;
  vPartSuppsBit->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  vPartSuppsBit->pArray = ppvVar3;
  pVVar10 = &local_b8;
  iVar1 = clock_gettime(3,(timespec *)pVVar10);
  if (iVar1 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_b8.pArray),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_b8._0_8_ * -1000000;
  }
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0x100;
  pvVar4 = malloc(0x800);
  __ptr[1] = pvVar4;
  vPartSuppsAll = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsAll->nCap = 0x100;
  vPartSuppsAll->nSize = 0;
  ppvVar5 = (void **)malloc(0x800);
  vPartSuppsAll->pArray = ppvVar5;
  local_60 = (long)local_78->nSize;
  if (local_60 < 1) {
    uVar16 = 0;
    local_c8 = 0;
LAB_0063ac89:
    if (ppvVar3 != (void **)0x0) goto LAB_0063ac93;
  }
  else {
    uVar19 = 0;
    local_90 = 0x100;
    local_80 = 1000;
    local_88 = 0x100;
    local_a8 = 0;
    local_a0 = (Vec_Ptr_t *)0x0;
    lVar11 = 0;
    local_48 = vPartSuppsBit;
    do {
      pVVar6 = (Vec_Int_t *)local_78->pArray[lVar11];
      local_70 = lVar11;
      local_40 = uVar19;
      if (pVVar6->nSize < 1) goto LAB_0063afa7;
      uVar2 = pVVar6->nSize - 1;
      pVVar6->nSize = uVar2;
      iVar1 = pVVar6->pArray[uVar2];
      uVar2 = Aig_ManPartitionSmartFindPart(vPartSuppsAll,pVVar10,vPartSuppsBit,local_94,pVVar6);
      local_58 = pVVar6;
      if (uVar2 == 0xffffffff) {
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        pVVar7->nCap = 0x20;
        pVVar7->nSize = 0;
        piVar8 = (int *)malloc(0x80);
        pVVar7->pArray = piVar8;
        Vec_IntPush(pVVar7,iVar1);
        piVar8 = (int *)malloc(0x10);
        iVar1 = pVVar6->nSize;
        piVar8[1] = iVar1;
        *piVar8 = iVar1;
        if ((long)iVar1 == 0) {
          sVar15 = 0;
          pvVar4 = (void *)0x0;
        }
        else {
          sVar15 = (long)iVar1 << 2;
          pvVar4 = malloc(sVar15);
        }
        *(void **)(piVar8 + 2) = pvVar4;
        memcpy(pvVar4,local_58->pArray,sVar15);
        uVar16 = local_90;
        iVar1 = (int)local_88;
        if ((int)local_a0 == iVar1) {
          if (iVar1 < 0x10) {
            if ((void *)__ptr[1] == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc((void *)__ptr[1],0x80);
            }
            __ptr[1] = pvVar4;
            *(undefined4 *)__ptr = 0x10;
            local_88 = 0x10;
          }
          else {
            local_88 = (ulong)(uint)(iVar1 * 2);
            if ((void *)__ptr[1] == (void *)0x0) {
              pvVar4 = malloc(local_88 * 8);
            }
            else {
              pvVar4 = realloc((void *)__ptr[1],local_88 * 8);
            }
            __ptr[1] = pvVar4;
            *(int *)__ptr = (int)local_88;
          }
        }
        else {
          pvVar4 = (void *)__ptr[1];
        }
        iVar1 = (int)uVar16;
        uVar2 = (int)local_a0 + 1;
        *(uint *)((long)__ptr + 4) = uVar2;
        *(Vec_Int_t **)((long)pvVar4 + (long)(int)local_a0 * 8) = pVVar7;
        if ((int)local_a8 == iVar1) {
          if (iVar1 < 0x10) {
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vPartSuppsAll->pArray,0x80);
            }
            vPartSuppsAll->pArray = ppvVar3;
            vPartSuppsAll->nCap = 0x10;
            local_90 = 0x10;
          }
          else {
            uVar14 = iVar1 * 2;
            sVar15 = (ulong)uVar14 * 8;
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(sVar15);
            }
            else {
              ppvVar3 = (void **)realloc(vPartSuppsAll->pArray,sVar15);
            }
            vPartSuppsAll->pArray = ppvVar3;
            vPartSuppsAll->nCap = uVar14;
            local_90 = (ulong)uVar14;
          }
        }
        else {
          ppvVar3 = vPartSuppsAll->pArray;
        }
        uVar14 = (int)local_a8 + 1;
        uVar16 = (ulong)uVar14;
        vPartSuppsAll->nSize = uVar14;
        ppvVar3[(int)local_a8] = piVar8;
        puVar9 = Aig_ManSuppCharStart(local_58,local_68->nObjs[2]);
        iVar17 = (int)local_40;
        iVar1 = (int)local_80;
        if (iVar17 == iVar1) {
          if (iVar1 < 0x10) {
            if (vPartSuppsBit->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vPartSuppsBit->pArray,0x80);
            }
            vPartSuppsBit->pArray = ppvVar3;
            vPartSuppsBit->nCap = 0x10;
            local_80 = 0x10;
          }
          else {
            local_80 = (ulong)(uint)(iVar1 * 2);
            if (vPartSuppsBit->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(local_80 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(vPartSuppsBit->pArray,local_80 * 8);
            }
            vPartSuppsBit->pArray = ppvVar3;
            vPartSuppsBit->nCap = (int)local_80;
          }
        }
        else {
          ppvVar3 = vPartSuppsBit->pArray;
        }
        pVVar10 = (Vec_Ptr_t *)(ulong)uVar2;
        vPartSuppsBit->nSize = iVar17 + 1U;
        ppvVar3[iVar17] = puVar9;
        uVar19 = (ulong)(iVar17 + 1U);
        local_a8 = (ulong)uVar14;
        local_a0 = pVVar10;
      }
      else {
        if (((int)uVar2 < 0) || ((int)local_a0 <= (int)uVar2)) goto LAB_0063af88;
        uVar16 = (ulong)uVar2;
        Vec_IntPush(*(Vec_Int_t **)(__ptr[1] + uVar16 * 8),iVar1);
        if ((int)local_a8 <= (int)uVar2) goto LAB_0063af88;
        ppvVar3 = vPartSuppsAll->pArray;
        pVVar7 = (Vec_Int_t *)ppvVar3[uVar16];
        pVVar6 = Vec_IntTwoMerge(pVVar7,pVVar6);
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
        }
        free(pVVar7);
        uVar19 = local_40;
        vPartSuppsBit = local_48;
        ppvVar3[uVar16] = pVVar6;
        if ((int)local_40 <= (int)uVar2) goto LAB_0063af88;
        Aig_ManSuppCharAdd((uint *)local_48->pArray[uVar16],local_58,local_68->nObjs[2]);
        uVar16 = local_a8 & 0xffffffff;
        pVVar10 = (Vec_Ptr_t *)((ulong)local_a0 & 0xffffffff);
      }
      lVar11 = local_70 + 1;
    } while (local_60 != lVar11);
    ppvVar3 = vPartSuppsBit->pArray;
    local_c8 = (int)pVVar10;
    if ((int)uVar19 < 1) goto LAB_0063ac89;
    uVar18 = 0;
    do {
      if (ppvVar3[uVar18] != (void *)0x0) {
        free(ppvVar3[uVar18]);
      }
      uVar18 = uVar18 + 1;
      vPartSuppsBit = local_48;
    } while ((uVar19 & 0xffffffff) != uVar18);
LAB_0063ac93:
    free(ppvVar3);
  }
  free(vPartSuppsBit);
  if (fVerbose != 0) {
    Abc_Print((int)vPartSuppsBit,"%s =","Parts");
    iVar17 = 3;
    iVar1 = clock_gettime(3,(timespec *)&local_b8);
    if (iVar1 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = (long)local_b8.pArray / 1000 + local_b8._0_8_ * 1000000;
    }
    Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar11 + local_50) / 1000000.0);
  }
  clock_gettime(3,(timespec *)&local_b8);
  ppvVar3 = vPartSuppsAll->pArray;
  iVar1 = (int)uVar16;
  if (iVar1 < 1) {
    uVar16 = (ulong)iVar1;
  }
  else {
    uVar19 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)ppvVar3[uVar19],(int)uVar19);
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar16);
  }
  qsort(ppvVar3,uVar16,8,Vec_VecSortCompare2);
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x100;
  pVVar10->nSize = 0;
  ppvVar3 = (void **)malloc(0x800);
  pVVar10->pArray = ppvVar3;
  if (0 < iVar1) {
    uVar19 = 0x100;
    lVar11 = 0;
    do {
      pvVar4 = vPartSuppsAll->pArray[lVar11];
      if (*(int *)((long)pvVar4 + 4) < 1) {
LAB_0063afa7:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar2 = *(int *)((long)pvVar4 + 4) - 1;
      *(uint *)((long)pvVar4 + 4) = uVar2;
      iVar1 = *(int *)(*(long *)((long)pvVar4 + 8) + (ulong)uVar2 * 4);
      if (((long)iVar1 < 0) || (local_c8 <= iVar1)) {
LAB_0063af88:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = *(void **)(__ptr[1] + (long)iVar1 * 8);
      iVar1 = (int)uVar19;
      if ((int)lVar11 == iVar1) {
        if (iVar1 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar10->pArray,0x80);
          }
          pVVar10->pArray = ppvVar3;
          pVVar10->nCap = 0x10;
          uVar19 = 0x10;
        }
        else {
          uVar19 = (ulong)(uint)(iVar1 * 2);
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar19 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar10->pArray,uVar19 * 8);
          }
          pVVar10->pArray = ppvVar3;
          pVVar10->nCap = iVar1 * 2;
        }
      }
      else {
        ppvVar3 = pVVar10->pArray;
      }
      lVar12 = lVar11 + 1;
      pVVar10->nSize = (int)lVar12;
      ppvVar3[lVar11] = pvVar4;
      lVar11 = lVar12;
    } while (lVar12 < (long)uVar16);
  }
  if ((void *)__ptr[1] != (void *)0x0) {
    free((void *)__ptr[1]);
  }
  free(__ptr);
  Aig_ManPartitionCompact(pVVar10,vPartSuppsAll,local_94);
  if (fVerbose != 0) {
    printf("Created %d partitions.\n",(ulong)(uint)pVVar10->nSize);
  }
  ppvVar3 = local_78->pArray;
  if ((int)local_60 < 1) {
    if (ppvVar3 != (void **)0x0) goto LAB_0063aef5;
  }
  else {
    lVar11 = 0;
    do {
      pvVar4 = ppvVar3[lVar11];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
      }
      lVar11 = lVar11 + 1;
    } while (local_60 != lVar11);
LAB_0063aef5:
    free(ppvVar3);
  }
  free(local_78);
  if (local_38 != (Vec_Ptr_t **)0x0) {
    *local_38 = vPartSuppsAll;
    return pVVar10;
  }
  iVar1 = vPartSuppsAll->nSize;
  ppvVar3 = vPartSuppsAll->pArray;
  if ((long)iVar1 < 1) {
    if (ppvVar3 == (void **)0x0) goto LAB_0063af69;
  }
  else {
    uVar16 = 0;
    do {
      pvVar4 = ppvVar3[uVar16];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(long)iVar1);
  }
  free(ppvVar3);
LAB_0063af69:
  free(vPartSuppsAll);
  return pVVar10;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmart( Aig_Man_t * p, int nSuppSizeLimit, int fVerbose, Vec_Ptr_t ** pvPartSupps )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;//, * vPartPtr;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // compute the supports for all outputs
clk = Abc_Clock();
    vSupports = Aig_ManSupports( p );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Aig_ManCiNum(p)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Aig_ManCiNum(p) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
    else
        *pvPartSupps = vPartSuppsAll;
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}